

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O0

binarydata * __thiscall network_pimpl::encode(network_pimpl *this)

{
  binarydata *in_RDI;
  int tacq;
  int tsrc;
  vector<EventDataType,_std::allocator<EventDataType>_> *in_stack_00000290;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000298;
  int *in_stack_000002a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_000002a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_000002b0;
  vector<HighFreqDataType,_std::allocator<HighFreqDataType>_> *in_stack_000002f0;
  int *in_stack_000002f8;
  int *in_stack_00000300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000318;
  int *in_stack_00000320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000328;
  
  NetworkDataType::
  serializedata<std::__cxx11::string_const,std::__cxx11::string_const,int_const,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>const,std::vector<EventDataType,std::allocator<EventDataType>>const,std::vector<HighFreqDataType,std::allocator<HighFreqDataType>>const,int,int,std::__cxx11::string_const,std::__cxx11::string_const,std::__cxx11::string_const,int_const,std::__cxx11::string_const>
            (in_stack_000002b0,in_stack_000002a8,in_stack_000002a0,in_stack_00000298,
             in_stack_00000290,in_stack_000002f0,in_stack_000002f8,in_stack_00000300,
             in_stack_00000308,in_stack_00000310,in_stack_00000318,in_stack_00000320,
             in_stack_00000328);
  return in_RDI;
}

Assistant:

binarydata network_pimpl::encode() const{
    int tsrc = (int)trodes_source;
    int tacq = (int)trodes_acquisition;
    return NetworkDataType::serializedata(endpoint, address, port, clients, events, hfdts,
                                          tsrc, tacq, trodes_filename,
                                          hardware_endpoint, hardware_address, hardware_port,
                                          timestamp_endpoint);
}